

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O1

int __thiscall Kvm::repl(Kvm *this,istream *in,ostream *out)

{
  char cVar1;
  Value *pVVar2;
  size_t in_RCX;
  void *__buf;
  char *__s;
  
  __s = "Fatal error -- READ!";
  do {
    std::__ostream_insert<char,std::char_traits<char>>(out,"kat> ",5);
    pVVar2 = (Value *)read(this,(int)in,__buf,in_RCX);
    cVar1 = (char)out;
    if (pVVar2 == (Value *)0x0) {
LAB_0010d0c0:
      puts(__s);
      std::__ostream_insert<char,std::char_traits<char>>(out,"Goodbye",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      return 0;
    }
    pVVar2 = eval(this,pVVar2,this->GLOBAL_ENV);
    if (pVVar2 == (Value *)0x0) {
      __s = "Fatal error -- EVAL!";
      goto LAB_0010d0c0;
    }
    print(this,pVVar2,out);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  } while( true );
}

Assistant:

int Kvm::repl(std::istream &in, std::ostream &out)
{
    while (true)
    {
        try
        {
            out << "kat> ";
            auto v = read(in);
            if (!v)
            {
                printf("Fatal error -- READ!\n");
                break;
            }
            auto r = eval(v, GLOBAL_ENV);
            if (!r)
            {
                printf("Fatal error -- EVAL!\n");
                break;
            }
            print(r, out);
            out << endl;
        } catch (KatException &e)
        {
            out << e.what() << endl;
            in.ignore(std::numeric_limits<std::streamsize>::max(), '\n');
        }
    }
    out << "Goodbye" << endl;
    return 0;
}